

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O2

int mbedtls_camellia_crypt_ctr
              (mbedtls_camellia_context *ctx,size_t length,size_t *nc_off,uchar *nonce_counter,
              uchar *stream_block,uchar *input,uchar *output)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar5 = (int)length;
  uVar6 = *nc_off;
  if (uVar6 < 0x10) {
    while (bVar7 = length != 0, length = length - 1, bVar7) {
      if (uVar6 == 0) {
        mbedtls_camellia_crypt_ecb(ctx,iVar5,nonce_counter,stream_block);
        uVar4 = 0x10;
        uVar3 = 0x10;
        do {
          bVar7 = uVar3 == 0;
          uVar3 = uVar3 - 1;
          if (bVar7) break;
          puVar1 = nonce_counter + (uVar4 - 1);
          *puVar1 = *puVar1 + '\x01';
          uVar4 = (ulong)uVar3;
        } while (*puVar1 == '\0');
      }
      bVar2 = *input;
      input = input + 1;
      *output = stream_block[uVar6] ^ bVar2;
      output = output + 1;
      uVar6 = (ulong)((int)uVar6 + 1U & 0xf);
    }
    *nc_off = uVar6;
    iVar5 = 0;
  }
  else {
    iVar5 = -0x24;
  }
  return iVar5;
}

Assistant:

int mbedtls_camellia_crypt_ctr( mbedtls_camellia_context *ctx,
                       size_t length,
                       size_t *nc_off,
                       unsigned char nonce_counter[16],
                       unsigned char stream_block[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c, i;
    size_t n;
    CAMELLIA_VALIDATE_RET( ctx != NULL );
    CAMELLIA_VALIDATE_RET( nonce_counter != NULL );
    CAMELLIA_VALIDATE_RET( stream_block  != NULL );
    CAMELLIA_VALIDATE_RET( nc_off != NULL );
    CAMELLIA_VALIDATE_RET( length == 0 || input  != NULL );
    CAMELLIA_VALIDATE_RET( length == 0 || output != NULL );

    n = *nc_off;
    if( n >= 16 )
        return( MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA );

    while( length-- )
    {
        if( n == 0 ) {
            mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, nonce_counter,
                                stream_block );

            for( i = 16; i > 0; i-- )
                if( ++nonce_counter[i - 1] != 0 )
                    break;
        }
        c = *input++;
        *output++ = (unsigned char)( c ^ stream_block[n] );

        n = ( n + 1 ) & 0x0F;
    }

    *nc_off = n;

    return( 0 );
}